

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O1

variable_access_map_t *
tchecker::variable_access(variable_access_map_t *__return_storage_ptr__,system_t *system)

{
  process_id_t pid;
  process_id_t *ppVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Hash_node_base *p_Var3;
  element_type *peVar4;
  typed_expression_t *ptVar5;
  typed_statement_t *stmt;
  const_iterator cVar6;
  edges_collection_const_iterator_t eVar7;
  __node_base _Var8;
  __node_base _Var9;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar10;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar11;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  clock_ids;
  edges_collection_const_iterator_t local_a8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->_empty_vid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_size = 0;
  (__return_storage_ptr__->_empty_vid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_capacity = 0;
  (__return_storage_ptr__->_empty_pid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_capacity = 0;
  (__return_storage_ptr__->_empty_vid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->_empty_pid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->_empty_pid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_size = 0;
  (__return_storage_ptr__->_p2v_map).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (__return_storage_ptr__->_p2v_map).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  (__return_storage_ptr__->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  (__return_storage_ptr__->_p2v_map).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  rVar10 = tchecker::system::edges_t::edges(&(system->super_system_t).super_system_t.super_edges_t);
  if ((shared_ptr<tchecker::system::edge_t> *)rVar10._begin.super_const_iterator._M_current !=
      rVar10._end.super_const_iterator._M_current.super_const_iterator) {
    do {
      local_a8 = rVar10._end.super_const_iterator._M_current;
      eVar7 = rVar10._begin.super_const_iterator._M_current;
      ppVar1 = *(process_id_t **)eVar7.super_const_iterator._M_current;
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)eVar7.super_const_iterator._M_current + 8);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      ptVar5 = ta::system_t::guard(system,ppVar1[1]);
      add_accesses(ptVar5,*ppVar1,__return_storage_ptr__);
      stmt = ta::system_t::statement(system,ppVar1[1]);
      pid = *ppVar1;
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_a0._M_buckets = &local_a0._M_single_bucket;
      local_a0._M_bucket_count = 1;
      local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a0._M_element_count = 0;
      local_a0._M_rehash_policy._M_max_load_factor = 1.0;
      local_a0._M_rehash_policy._M_next_resize = 0;
      local_a0._M_single_bucket = (__node_base_ptr)0x0;
      extract_read_variables
                (stmt,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&local_68,
                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&local_a0);
      for (_Var8._M_nxt = local_68._M_before_begin._M_nxt;
          _Var9._M_nxt = local_a0._M_before_begin._M_nxt, _Var8._M_nxt != (_Hash_node_base *)0x0;
          _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt) {
        variable_access_map_t::add
                  (__return_storage_ptr__,*(variable_id_t *)&_Var8._M_nxt[1]._M_nxt,VTYPE_CLOCK,
                   VACCESS_READ,pid);
      }
      for (; _Var8._M_nxt = local_68._M_before_begin._M_nxt, _Var9._M_nxt != (_Hash_node_base *)0x0;
          _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
        variable_access_map_t::add
                  (__return_storage_ptr__,*(variable_id_t *)&_Var9._M_nxt[1]._M_nxt,VTYPE_INTVAR,
                   VACCESS_READ,pid);
      }
      while (_Var8._M_nxt != (_Hash_node_base *)0x0) {
        p_Var3 = (_Var8._M_nxt)->_M_nxt;
        operator_delete(_Var8._M_nxt,0x10);
        _Var8._M_nxt = p_Var3;
      }
      memset(local_68._M_buckets,0,local_68._M_bucket_count << 3);
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      _Var8._M_nxt = local_a0._M_before_begin._M_nxt;
      while (_Var8._M_nxt != (_Hash_node_base *)0x0) {
        p_Var3 = (_Var8._M_nxt)->_M_nxt;
        operator_delete(_Var8._M_nxt,0x10);
        _Var8._M_nxt = p_Var3;
      }
      memset(local_a0._M_buckets,0,local_a0._M_bucket_count << 3);
      local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a0._M_element_count = 0;
      extract_written_variables
                (stmt,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&local_68,
                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&local_a0);
      for (_Var8._M_nxt = local_68._M_before_begin._M_nxt;
          _Var9._M_nxt = local_a0._M_before_begin._M_nxt, _Var8._M_nxt != (_Hash_node_base *)0x0;
          _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt) {
        variable_access_map_t::add
                  (__return_storage_ptr__,*(variable_id_t *)&_Var8._M_nxt[1]._M_nxt,VTYPE_CLOCK,
                   VACCESS_WRITE,pid);
      }
      for (; _Var9._M_nxt != (_Hash_node_base *)0x0; _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
        variable_access_map_t::add
                  (__return_storage_ptr__,*(variable_id_t *)&_Var9._M_nxt[1]._M_nxt,VTYPE_INTVAR,
                   VACCESS_WRITE,pid);
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_a0);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      rVar10._end.super_const_iterator._M_current = local_a8.super_const_iterator._M_current;
      rVar10._begin.super_const_iterator._M_current =
           (const_iterator)(const_iterator)((long)eVar7.super_const_iterator._M_current + 0x10);
    } while ((shared_ptr<tchecker::system::edge_t> *)
             ((long)eVar7.super_const_iterator._M_current + 0x10) !=
             local_a8.super_const_iterator._M_current);
  }
  rVar11 = tchecker::system::locs_t::locations
                     (&(system->super_system_t).super_system_t.super_locs_t);
  for (cVar6._M_current =
            (shared_ptr<tchecker::system::loc_t> *)rVar11._begin.super_const_iterator._M_current;
      (const_iterator)cVar6._M_current !=
      rVar11._end.super_const_iterator._M_current.super_const_iterator;
      cVar6._M_current = cVar6._M_current + 1) {
    peVar4 = ((cVar6._M_current)->
             super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = ((cVar6._M_current)->
             super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    ptVar5 = ta::system_t::invariant(system,peVar4->_id);
    add_accesses(ptVar5,peVar4->_pid,__return_storage_ptr__);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::variable_access_map_t variable_access(tchecker::ta::system_t const & system)
{
  tchecker::variable_access_map_t map;

  for (tchecker::system::edge_const_shared_ptr_t edge : system.edges()) {
    tchecker::add_accesses(system.guard(edge->id()), edge->pid(), map);
    tchecker::add_accesses(system.statement(edge->id()), edge->pid(), map);
  }

  for (tchecker::system::loc_const_shared_ptr_t loc : system.locations())
    tchecker::add_accesses(system.invariant(loc->id()), loc->pid(), map);

  return map;
}